

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

int dodrink(obj *potion)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  code *pcVar7;
  
  if (u.uprops[0x22].intrinsic != 0) {
    pline("If you can\'t breathe air, how can you drink liquid?");
    return 0;
  }
  cVar1 = level->locations[u.ux][u.uy].typ;
  pcVar7 = (code *)0x0;
  if (((cVar1 == '\x1c') && (u.uprops[0x12].intrinsic == 0)) && (u.uprops[0x12].extrinsic == 0)) {
    if ((youmonst.data)->mlet == '\x05') {
      pcVar7 = (code *)0x0;
    }
    else {
      pcVar7 = drinkfountain;
    }
  }
  if (cVar1 == '\x1f') {
    pcVar7 = drinksink;
  }
  if (((u._1052_1_ & 2) == 0) ||
     (cVar1 = yn_function("Drink the water around you?","yn",'n'), cVar1 != 'y')) {
    pcVar6 = "\x15\x16\b";
    if (pcVar7 == (code *)0x0) {
      pcVar6 = "\b";
    }
    if (potion == (obj *)0x0) {
      potion = getobj(pcVar6,"drink",(obj **)0x0);
LAB_0021b0f6:
      if (potion != (obj *)0x0) {
        if (potion == &zeroobj) {
          if (pcVar7 == (code *)0x0) {
            warning("dodrink: zeroobj selected without terrain");
            return 0;
          }
          (*pcVar7)();
        }
        else {
          potion->field_0x4c = potion->field_0x4c | 0x80;
          pcVar6 = obj_descr[objects[potion->otyp].oc_descr_idx].oc_descr;
          if (pcVar6 == (char *)0x0) {
LAB_0021b1cd:
            iVar3 = dopotion(potion);
            return iVar3;
          }
          iVar3 = strcmp(pcVar6,"milky");
          if ((flags.ghost_count < 0x78 && iVar3 == 0) &&
             (lVar5 = (long)flags.ghost_count, uVar4 = mt_random(),
             SUB168(ZEXT416(uVar4) % SEXT816(lVar5 * 2 + 0xd),0) == 0)) {
            ghost_from_bottle();
          }
          else {
            iVar3 = strcmp(pcVar6,"smoky");
            if ((0x77 < flags.djinni_count || iVar3 != 0) ||
               (lVar5 = (long)flags.djinni_count, uVar4 = mt_random(),
               SUB168(ZEXT416(uVar4) % SEXT816(lVar5 * 2 + 0xd),0) != 0)) goto LAB_0021b1cd;
            djinni_from_bottle(potion);
          }
          useup(potion);
        }
        goto LAB_0021b1ff;
      }
    }
    else {
      bVar2 = validate_object(potion,pcVar6,"drink");
      if (bVar2 != '\0') goto LAB_0021b0f6;
    }
    iVar3 = 0;
  }
  else {
    if (urole.malenum == 0x159) {
      pcVar6 = "No thank you, fish make love in it!";
    }
    else {
      pcVar6 = "Do you know what lives in this water!?";
    }
    pline(pcVar6);
LAB_0021b1ff:
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int dodrink(struct obj *potion)
{
	const char *potion_descr;
	void (*terrain)(void) = NULL;
	const char *drink_choices = NULL;

	if (Strangled) {
		pline("If you can't breathe air, how can you drink liquid?");
		return 0;
	}
	/* Is there a fountain to drink from here? */
	if (IS_FOUNTAIN(level->locations[u.ux][u.uy].typ) && !Levitation) {
		terrain = drinkfountain;
	}
	/* Or a kitchen sink? */
	if (IS_SINK(level->locations[u.ux][u.uy].typ)) {
		terrain = drinksink;
	}

	/* Or are you surrounded by water? */
	if (Underwater) {
		if (yn("Drink the water around you?") == 'y') {
			/* Indiana Jones 3 */
			if (Role_if(PM_ARCHEOLOGIST))
			    pline("No thank you, fish make love in it!");
			else
			    pline("Do you know what lives in this water!?");
			return 1;
		}
	}

	drink_choices = terrain ? beverages_and_fountains : beverages;
	if (potion && !validate_object(potion, drink_choices, "drink"))
		return 0;
	else if (!potion)
		potion = getobj(drink_choices, "drink", NULL);
	if (!potion) return 0;

	/* Quaff from fountains and sinks with "q," */
	if (potion == &zeroobj) {
	    if (!terrain) {
		warning("dodrink: zeroobj selected without terrain");
		return 0;
	    }
	    terrain();
	    return 1;
	}

	potion->in_use = TRUE;		/* you've opened the stopper */

#define POTION_OCCUPANT_CHANCE(n) (13 + 2*(n))	/* also in muse.c */

	potion_descr = OBJ_DESCR(objects[potion->otyp]);
	if (potion_descr) {
	    if (!strcmp(potion_descr, "milky") &&
		    flags.ghost_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.ghost_count))) {
		ghost_from_bottle();
		useup(potion);
		return 1;
	    } else if (!strcmp(potion_descr, "smoky") &&
		    flags.djinni_count < MAXMONNO &&
		    !rn2(POTION_OCCUPANT_CHANCE(flags.djinni_count))) {
		djinni_from_bottle(potion);
		useup(potion);
		return 1;
	    }
	}
	return dopotion(potion);
}